

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall cmComputeLinkDepends::DisplayComponents(cmComputeLinkDepends *this)

{
  cmComputeComponentGraph *pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  pointer pcVar7;
  
  fwrite("The strongly connected components are:\n",0x27,1,_stderr);
  pcVar1 = this->CCG;
  if ((pcVar1->Components).super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pcVar1->Components).super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      iVar4 = (int)uVar5;
      fprintf(_stderr,"Component (%u):\n",uVar5);
      pcVar2 = (pcVar1->Components).
               super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = *(int **)&pcVar2[uVar5].super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
      if (piVar6 != *(pointer *)
                     ((long)&pcVar2[uVar5].super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)) {
        do {
          fprintf(_stderr,"  item %d [%s]\n",(long)*piVar6,
                  (this->EntryList).
                  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start[*piVar6].Item._M_dataplus._M_p);
          piVar6 = piVar6 + 1;
        } while (piVar6 != *(pointer *)
                            ((long)&pcVar2[uVar5].super_vector<int,_std::allocator<int>_>.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl + 8));
      }
      pcVar3 = (this->CCG->ComponentGraph).
               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar7 = *(pointer *)
                &pcVar3[iVar4].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                 super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      if (pcVar7 != *(pointer *)
                     ((long)&pcVar3[iVar4].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                             super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8)) {
        do {
          fprintf(_stderr,"  followed by Component (%d)\n",(ulong)(uint)pcVar7->Dest);
          pcVar7 = pcVar7 + 1;
        } while (pcVar7 != *(pointer *)
                            ((long)&pcVar3[iVar4].
                                    super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                                    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> +
                            8));
      }
      fprintf(_stderr,"  topo order index %d\n",
              (ulong)(uint)(this->ComponentOrder).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar5]);
      uVar5 = (ulong)(iVar4 + 1);
    } while (uVar5 < (ulong)(((long)(pcVar1->Components).
                                    super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pcVar1->Components).
                                   super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18));
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void
cmComputeLinkDepends::DisplayComponents()
{
  fprintf(stderr, "The strongly connected components are:\n");
  std::vector<NodeList> const& components = this->CCG->GetComponents();
  for(unsigned int c=0; c < components.size(); ++c)
    {
    fprintf(stderr, "Component (%u):\n", c);
    NodeList const& nl = components[c];
    for(NodeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni)
      {
      int i = *ni;
      fprintf(stderr, "  item %d [%s]\n", i,
              this->EntryList[i].Item.c_str());
      }
    EdgeList const& ol = this->CCG->GetComponentGraphEdges(c);
    for(EdgeList::const_iterator oi = ol.begin(); oi != ol.end(); ++oi)
      {
      int i = *oi;
      fprintf(stderr, "  followed by Component (%d)\n", i);
      }
    fprintf(stderr, "  topo order index %d\n",
            this->ComponentOrder[c]);
    }
  fprintf(stderr, "\n");
}